

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::skip_delimited_group(CTcTokenizer *this,utf8_ptr *p,int parts_to_skip)

{
  wchar_t wVar1;
  wchar_t parts_to_skip_00;
  int in_EDX;
  CTcTokenizer *in_RSI;
  wchar_t ch;
  wchar_t delim;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  wVar1 = utf8_ptr::getch((utf8_ptr *)0x2ee485);
  if ((wVar1 != L'\0') && (wVar1 != L'\x04')) {
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    while (((in_EDX != 0 &&
            (parts_to_skip_00 = utf8_ptr::getch((utf8_ptr *)0x2ee4bb), parts_to_skip_00 != L'\0'))
           && (parts_to_skip_00 != L'\x04'))) {
      if (parts_to_skip_00 == wVar1) {
        in_EDX = in_EDX + -1;
        utf8_ptr::inc((utf8_ptr *)CONCAT44(parts_to_skip_00,in_stack_ffffffffffffffe0));
      }
      else if (parts_to_skip_00 == L'\x05') {
        skip_delimited_group(in_RSI,(utf8_ptr *)CONCAT44(in_EDX,wVar1),5);
      }
      else if ((parts_to_skip_00 == L'\a') || (parts_to_skip_00 == L'\b')) {
        skip_delimited_group(in_RSI,(utf8_ptr *)CONCAT44(in_EDX,wVar1),parts_to_skip_00);
      }
      else {
        utf8_ptr::inc((utf8_ptr *)CONCAT44(parts_to_skip_00,in_stack_ffffffffffffffe0));
      }
    }
  }
  return;
}

Assistant:

void CTcTokenizer::skip_delimited_group(utf8_ptr *p, int parts_to_skip)
{
    wchar_t delim;

    /* get the delimiter character */
    delim = p->getch();

    /* 
     *   if the delimiter put us at the end of the line, there's nothing to
     *   skip 
     */
    if (delim == 0 || delim == TOK_END_PP_LINE)
        return;

    /* skip the delimiter */
    p->inc();

    /* keep going until we've skipped the desired number of parts */
    while (parts_to_skip != 0)
    {
        wchar_t ch;

        /* read the next character */
        ch = p->getch();

        /* if it's the end of the line, give up */
        if (ch == 0 || ch == TOK_END_PP_LINE)
        {
            /* 
             *   we ran out of input before reaching the delimiter, so this
             *   is implicitly the end of it 
             */
            return;
        }

        /* check what we have */
        if (ch == delim)
        {
            /* that's one less part to skip */
            --parts_to_skip;

            /* skip it */
            p->inc();
        }
        else if (ch == TOK_MACRO_FOREACH_FLAG)
        {
            /* it's a nested #foreach - skip all of its parts */
            skip_delimited_group(p, 2);
        }
        else if (ch == TOK_MACRO_IFEMPTY_FLAG
                 || ch == TOK_MACRO_IFNEMPTY_FLAG)
        {
            /* nested #ifempty or #ifnempty - skip its expansion */
            skip_delimited_group(p, 1);
        }
        else
        {
            /* it's nothing special to us - skip it */
            p->inc();
        }
    }
}